

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O0

void __thiscall LongReadsDatastore::print_status(LongReadsDatastore *this)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  size_type sVar6;
  reference puVar7;
  long lVar8;
  long in_RDI;
  undefined4 uVar9;
  undefined4 uVar16;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  unsigned_long s_1;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  uint64_t acc;
  double on80s;
  double on50s;
  double on20s;
  uint32_t s;
  int ri;
  uint64_t total_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> read_sizes;
  ostream *log_no_date;
  ostream *in_stack_fffffffffffffea8;
  LongReadsMapper *in_stack_fffffffffffffeb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffffec8;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_88;
  ulong local_80;
  double local_78;
  double local_70;
  double local_68;
  ulong local_50;
  uint local_48;
  int local_34;
  ulong local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  ostream *local_10;
  undefined1 auVar10 [16];
  
  local_10 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                               SUB81((ulong)in_stack_fffffffffffffed8 >> 0x18,0));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3d500d);
  local_30 = 0;
  local_34 = 1;
  while( true ) {
    uVar2 = (ulong)local_34;
    sVar3 = size((LongReadsDatastore *)0x3d5041);
    if (sVar3 < uVar2) break;
    pvVar4 = std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::operator[]
                       ((vector<ReadPosSize,_std::allocator<ReadPosSize>_> *)(in_RDI + 0x10),
                        (long)local_34);
    local_48 = pvVar4->record_size;
    local_30 = local_30 + local_48;
    local_50 = (ulong)local_48;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb0,
               (value_type_conflict1 *)in_stack_fffffffffffffea8);
    local_34 = local_34 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::rbegin(in_stack_fffffffffffffeb8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::rend(in_stack_fffffffffffffeb8);
  std::
  sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  uVar16 = (undefined4)(local_30 >> 0x20);
  auVar10._8_4_ = uVar16;
  auVar10._0_8_ = local_30;
  auVar10._12_4_ = 0x45300000;
  uVar9 = (undefined4)local_30;
  local_68 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar9) - 4503599627370496.0)) * 0.2;
  auVar11._8_4_ = uVar16;
  auVar11._0_8_ = local_30;
  auVar11._12_4_ = 0x45300000;
  local_70 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar9) - 4503599627370496.0)) * 0.5;
  auVar12._8_4_ = uVar16;
  auVar12._0_8_ = local_30;
  auVar12._12_4_ = 0x45300000;
  local_78 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar9) - 4503599627370496.0)) * 0.8;
  poVar5 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffed8 >> 0x18,0));
  poVar5 = std::operator<<(poVar5,"The datastore on ");
  poVar5 = std::operator<<(poVar5,(string *)(in_RDI + 0x28));
  poVar5 = std::operator<<(poVar5," contains ");
  sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_28);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
  poVar5 = std::operator<<(poVar5," reads with ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_30);
  std::operator<<(poVar5,"bp, ");
  local_80 = 0;
  local_88 = &local_28;
  local_90._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffea8
                 );
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffea8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffeb0,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffea8);
    if (!bVar1) break;
    puVar7 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_90);
    uVar2 = *puVar7;
    if (local_80 == 0) {
      poVar5 = std::operator<<(local_10,"N0: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
      std::operator<<(poVar5,"bp  ");
    }
    auVar17._8_4_ = (int)(local_80 >> 0x20);
    auVar17._0_8_ = local_80;
    auVar17._12_4_ = 0x45300000;
    if (((auVar17._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_80) - 4503599627370496.0) < local_68) &&
       (lVar8 = local_80 + uVar2, auVar13._8_4_ = (int)((ulong)lVar8 >> 0x20), auVar13._0_8_ = lVar8
       , auVar13._12_4_ = 0x45300000,
       local_68 <
       (auVar13._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0))) {
      poVar5 = std::operator<<(local_10,"N20: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
      std::operator<<(poVar5,"bp  ");
    }
    auVar18._8_4_ = (int)(local_80 >> 0x20);
    auVar18._0_8_ = local_80;
    auVar18._12_4_ = 0x45300000;
    if (((auVar18._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_80) - 4503599627370496.0) < local_70) &&
       (lVar8 = local_80 + uVar2, auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20), auVar14._0_8_ = lVar8
       , auVar14._12_4_ = 0x45300000,
       local_70 <
       (auVar14._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0))) {
      poVar5 = std::operator<<(local_10,"N50: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
      std::operator<<(poVar5,"bp  ");
    }
    auVar19._8_4_ = (int)(local_80 >> 0x20);
    auVar19._0_8_ = local_80;
    auVar19._12_4_ = 0x45300000;
    if (((auVar19._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_80) - 4503599627370496.0) < local_78) &&
       (lVar8 = local_80 + uVar2, auVar15._8_4_ = (int)((ulong)lVar8 >> 0x20), auVar15._0_8_ = lVar8
       , auVar15._12_4_ = 0x45300000,
       local_78 <
       (auVar15._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0))) {
      in_stack_fffffffffffffec0 = std::operator<<(local_10,"N80: ");
      poVar5 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffec0,uVar2);
      std::operator<<(poVar5,"bp  ");
    }
    local_80 = uVar2 + local_80;
    if (local_80 == local_30) {
      in_stack_fffffffffffffeb0 = (LongReadsMapper *)std::operator<<(local_10,"N100: ");
      in_stack_fffffffffffffea8 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffeb0,uVar2);
      std::operator<<(in_stack_fffffffffffffea8,"bp  ");
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_90);
  }
  std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
  LongReadsMapper::print_status(in_stack_fffffffffffffeb0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffec0);
  return;
}

Assistant:

void LongReadsDatastore::print_status() const {
    auto &log_no_date=sdglib::OutputLog(sdglib::LogLevels::INFO,false);
    std::vector<uint64_t> read_sizes;
    uint64_t total_size=0;
    for (auto ri=1;ri<=size();++ri) {
        auto s=read_to_fileRecord[ri].record_size;
            total_size += s;
            read_sizes.push_back(s);
    }
    std::sort(read_sizes.rbegin(),read_sizes.rend());
    auto on20s=total_size*.2;
    auto on50s=total_size*.5;
    auto on80s=total_size*.8;
    sdglib::OutputLog() <<"The datastore on " << filename << " contains "<<read_sizes.size()<<" reads with "<<total_size<<"bp, ";
    uint64_t acc=0;
    for (auto s:read_sizes){
        if (acc==0)  log_no_date<<"N0: "<<s<<"bp  ";
        if (acc<on20s and acc+s>on20s) log_no_date<<"N20: "<<s<<"bp  ";
        if (acc<on50s and acc+s>on50s) log_no_date<<"N50: "<<s<<"bp  ";
        if (acc<on80s and acc+s>on80s) log_no_date<<"N80: "<<s<<"bp  ";
        acc+=s;
        if (acc==total_size)  log_no_date<<"N100: "<<s<<"bp  ";
    }
    log_no_date<<std::endl;

    mapper.print_status();
}